

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_util.c
# Opt level: O0

void CMtransport_trace(CManager cm,char *format,...)

{
  FILE *__stream;
  char in_AL;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  CManager in_XMM0_Qb;
  timespec ts;
  va_list ap;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 in_stack_ffffffffffffff48;
  CMTraceType trace_type;
  CManager in_stack_ffffffffffffff50;
  timespec local_38;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_10;
  long local_8;
  
  trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  if (in_AL != '\0') {
    in_stack_ffffffffffffff50 = in_XMM0_Qb;
    trace_type = (CMTraceType)((ulong)in_XMM0_Qa >> 0x20);
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffff50,trace_type);
    if (iVar1 == 0) {
      return;
    }
  }
  else if (CMtrace_val[5] == 0) {
    return;
  }
  if (CMtrace_PID != 0) {
    __stream = *(FILE **)(local_8 + 0x120);
    _Var2 = getpid();
    pVar3 = pthread_self();
    fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_38);
    fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
  }
  local_18 = local_e8;
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  vfprintf(*(FILE **)(local_8 + 0x120),local_10,&local_28);
  fprintf(*(FILE **)(local_8 + 0x120),"\n");
  return;
}

Assistant:

extern void
CMtransport_trace(CManager cm, const char *format, ...)
{
#ifndef MODULE
    va_list ap;
    if (CMtrace_on(cm, CMTransportVerbose)) {
        if (CMtrace_PID) {
            fprintf(cm->CMTrace_file, "P%lxT%lx - ", (long) getpid(), (long)thr_thread_self());
        }
        if (CMtrace_timing) {
            TRACE_TIME_DECL;
            TRACE_TIME_GET;
            fprintf(cm->CMTrace_file, TRACE_TIME_PRINTDETAILS);
        }
#ifdef STDC_HEADERS
	va_start(ap, format);
#else
	va_start(ap);
#endif
	vfprintf(cm->CMTrace_file, format, ap);
	va_end(ap);
	(void)cm;
	fprintf(cm->CMTrace_file, "\n");
    }
#endif
}